

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O1

void av1_set_offsets_without_segment_id
               (AV1_COMP *cpi,TileInfo *tile,MACROBLOCK *x,int mi_row,int mi_col,BLOCK_SIZE bsize)

{
  uint8_t uVar1;
  byte bVar2;
  byte bVar3;
  BLOCK_SIZE BVar4;
  uint uVar5;
  int mi_ext_col;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  MB_MODE_INFO *pMVar10;
  uint plane_end;
  ulong uVar11;
  bool bVar12;
  uint uVar13;
  int iVar14;
  MB_MODE_INFO **ppMVar15;
  ENTROPY_CONTEXT **ppEVar16;
  ENTROPY_CONTEXT (*paEVar17) [32];
  byte bVar18;
  undefined7 in_register_00000089;
  byte bVar19;
  long lVar20;
  int col_offset;
  
  uVar1 = ((cpi->common).seq_params)->monochrome;
  uVar11 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar11];
  bVar3 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar11];
  iVar9 = (cpi->common).mi_params.mi_stride;
  iVar14 = iVar9 * mi_row + mi_col;
  iVar8 = mi_row / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [(cpi->common).mi_params.mi_alloc_bsize];
  iVar6 = mi_col / (int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                              [(cpi->common).mi_params.mi_alloc_bsize];
  (cpi->common).mi_params.mi_grid_base[iVar14] =
       (cpi->common).mi_params.mi_alloc + ((cpi->common).mi_params.mi_alloc_stride * iVar8 + iVar6);
  ppMVar15 = (cpi->common).mi_params.mi_grid_base + iVar14;
  plane_end = (uint)(uVar1 == '\0') * 2 + 1;
  (x->e_mbd).mi = ppMVar15;
  (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar14;
  (x->e_mbd).tx_type_map_stride = iVar9;
  x->mbmi_ext_frame =
       (cpi->mbmi_ext_info).frame_base + (iVar8 * (cpi->mbmi_ext_info).stride + iVar6);
  ppEVar16 = (x->e_mbd).above_entropy_context;
  paEVar17 = (x->e_mbd).left_entropy_context;
  lVar20 = 0;
  iVar9 = mi_col;
  uVar7 = mi_row;
  do {
    BVar4 = (*ppMVar15)->bsize;
    iVar6 = *(int *)((long)(x->e_mbd).plane[0].pre + lVar20 * 8 + -0x2c);
    uVar13 = mi_row - 1U;
    if ((0x20005UL >> (BVar4 & 0x3f) & 1) == 0) {
      uVar13 = uVar7;
    }
    iVar8 = *(int *)((long)(x->e_mbd).plane[0].pre + lVar20 * 8 + -0x28);
    if (iVar8 == 0) {
      uVar13 = uVar7;
    }
    if ((mi_row & 1U) != 0) {
      uVar7 = uVar13;
    }
    iVar14 = mi_col + -1;
    if ((0x10003UL >> (BVar4 & 0x3f) & 1) == 0) {
      iVar14 = iVar9;
    }
    if (iVar6 == 0) {
      iVar14 = iVar9;
    }
    if ((mi_col & 1U) != 0) {
      iVar9 = iVar14;
    }
    *(ENTROPY_CONTEXT **)((x->e_mbd).plane[0].seg_dequant_QTX + lVar20 * 2 + -4) =
         *ppEVar16 + (iVar9 >> ((byte)iVar6 & 0x1f));
    *(ENTROPY_CONTEXT **)((x->e_mbd).plane[0].seg_dequant_QTX + lVar20 * 2 + -2) =
         *paEVar17 + ((uVar7 & 0x1f) >> ((byte)iVar8 & 0x1f));
    lVar20 = lVar20 + 0x146;
    paEVar17 = paEVar17 + 1;
    ppEVar16 = ppEVar16 + 1;
  } while ((ulong)plane_end * 0x146 - lVar20 != 0);
  (x->e_mbd).above_txfm_context = (cpi->common).above_contexts.txfm[tile->tile_row] + mi_col;
  (x->e_mbd).left_txfm_context = (x->e_mbd).left_txfm_context_buffer + (mi_row & 0x1f);
  lVar20 = 0;
  av1_setup_dst_planes
            ((x->e_mbd).plane,bsize,&((cpi->common).cur_frame)->buf,mi_row,mi_col,0,plane_end);
  iVar9 = (cpi->oxcf).border_in_pixels;
  iVar14 = 8 - (iVar9 + mi_row * 4);
  iVar8 = (uint)bVar3 + mi_row;
  iVar6 = iVar8 * -4 + -8;
  if (iVar6 < iVar14) {
    iVar6 = iVar14;
  }
  (x->mv_limits).row_min = iVar6;
  iVar14 = (cpi->common).mi_params.mi_rows - mi_row;
  iVar6 = iVar14 * 4 + 8;
  iVar14 = iVar9 + (iVar14 - (uint)bVar3) * 4 + -8;
  if (iVar14 < iVar6) {
    iVar6 = iVar14;
  }
  (x->mv_limits).row_max = iVar6;
  iVar14 = 8 - (iVar9 + mi_col * 4);
  uVar7 = (uint)bVar2 + mi_col;
  iVar6 = uVar7 * -4 + -8;
  if (iVar6 < iVar14) {
    iVar6 = iVar14;
  }
  (x->mv_limits).col_min = iVar6;
  iVar14 = (cpi->common).mi_params.mi_cols - mi_col;
  iVar6 = iVar14 * 4 + 8;
  iVar9 = iVar9 + (iVar14 - (uint)bVar2) * 4 + -8;
  if (iVar9 < iVar6) {
    iVar6 = iVar9;
  }
  (x->mv_limits).col_max = iVar6;
  do {
    bVar18 = (byte)((uint)bVar3 * 4 >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar20 + -0x28) & 0x1f));
    bVar19 = (byte)((uint)bVar2 * 4 >>
                   (*(byte *)((long)(x->e_mbd).plane[0].pre + lVar20 + -0x2c) & 0x1f));
    if (bVar19 < 5) {
      bVar19 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar20 + 0x90) = bVar19;
    if (bVar18 < 5) {
      bVar18 = 4;
    }
    *(byte *)((long)((x->e_mbd).plane[0].seg_iqmatrix + -1) + lVar20 + 0x91) = bVar18;
    lVar20 = lVar20 + 0xa30;
  } while ((ulong)plane_end * 0xa30 - lVar20 != 0);
  iVar9 = (cpi->common).mi_params.mi_rows;
  iVar6 = (cpi->common).mi_params.mi_cols;
  (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
  (x->e_mbd).mb_to_bottom_edge = (iVar9 - iVar8) * 0x20;
  (x->e_mbd).mb_to_left_edge = mi_col * -0x20;
  (x->e_mbd).mb_to_right_edge = (iVar6 - uVar7) * 0x20;
  (x->e_mbd).mi_row = mi_row;
  (x->e_mbd).mi_col = mi_col;
  iVar9 = tile->mi_row_start;
  (x->e_mbd).up_available = iVar9 < mi_row;
  uVar13 = (x->e_mbd).plane[1].subsampling_x;
  uVar5 = (x->e_mbd).plane[1].subsampling_y;
  iVar6 = tile->mi_col_start;
  (x->e_mbd).chroma_up_available = iVar9 < mi_row;
  (x->e_mbd).left_available = iVar6 < mi_col;
  bVar12 = iVar6 < mi_col + -1;
  if (uVar13 == 0) {
    bVar12 = iVar6 < mi_col;
  }
  if ((0x3efffcUL >> ((ulong)bsize & 0x3f) & 1) != 0) {
    bVar12 = iVar6 < mi_col;
  }
  (x->e_mbd).chroma_left_available = bVar12;
  if ((0x20005UL >> ((ulong)bsize & 0x3f) & 1) != 0 && uVar5 != 0) {
    (x->e_mbd).chroma_up_available = iVar9 < (int)(mi_row - 1U);
  }
  if (iVar9 < mi_row) {
    pMVar10 = (x->e_mbd).mi[-(long)(x->e_mbd).mi_stride];
  }
  else {
    pMVar10 = (MB_MODE_INFO *)0x0;
  }
  (x->e_mbd).above_mbmi = pMVar10;
  if (iVar6 < mi_col) {
    pMVar10 = (x->e_mbd).mi[-1];
  }
  else {
    pMVar10 = (MB_MODE_INFO *)0x0;
  }
  (x->e_mbd).left_mbmi = pMVar10;
  if (((mi_row & 1U) == 0) && ((bVar3 & uVar5 != 0) != 0)) {
    (x->e_mbd).is_chroma_ref = false;
  }
  else {
    if (((mi_col & 1U) == 0) && ((bVar2 & 1) != 0)) {
      (x->e_mbd).is_chroma_ref = uVar13 == 0;
      if (uVar13 != 0) goto LAB_001e5b7d;
    }
    else {
      (x->e_mbd).is_chroma_ref = true;
    }
    iVar9 = (x->e_mbd).mi_stride;
    iVar6 = (uVar13 & mi_col) + (uVar5 & mi_row) * iVar9;
    ppMVar15 = (x->e_mbd).mi;
    if ((x->e_mbd).chroma_up_available == true) {
      pMVar10 = ppMVar15[(long)-iVar6 + (long)(int)(uVar13 - iVar9)];
    }
    else {
      pMVar10 = (MB_MODE_INFO *)0x0;
    }
    (x->e_mbd).chroma_above_mbmi = pMVar10;
    if (bVar12 == false) {
      pMVar10 = (MB_MODE_INFO *)0x0;
    }
    else {
      pMVar10 = ppMVar15[(long)-iVar6 + (long)(int)(iVar9 * uVar5) + -1];
    }
    (x->e_mbd).chroma_left_mbmi = pMVar10;
  }
LAB_001e5b7d:
  (x->e_mbd).height = bVar3;
  (x->e_mbd).width = bVar2;
  (x->e_mbd).is_last_vertical_rect = false;
  if ((bVar2 < bVar3) && ((bVar3 - 1 & uVar7) == 0)) {
    (x->e_mbd).is_last_vertical_rect = true;
  }
  (x->e_mbd).is_first_horizontal_rect = false;
  if ((bVar3 < bVar2) && ((bVar2 - 1 & mi_row) == 0)) {
    (x->e_mbd).is_first_horizontal_rect = true;
  }
  av1_setup_src_planes(x,cpi->source,mi_row,mi_col,plane_end,bsize);
  iVar9 = tile->tile_col;
  (x->e_mbd).tile.tile_row = tile->tile_row;
  (x->e_mbd).tile.tile_col = iVar9;
  iVar9 = tile->mi_row_end;
  iVar6 = tile->mi_col_start;
  iVar8 = tile->mi_col_end;
  (x->e_mbd).tile.mi_row_start = tile->mi_row_start;
  (x->e_mbd).tile.mi_row_end = iVar9;
  (x->e_mbd).tile.mi_col_start = iVar6;
  (x->e_mbd).tile.mi_col_end = iVar8;
  return;
}

Assistant:

void av1_set_offsets_without_segment_id(const AV1_COMP *const cpi,
                                        const TileInfo *const tile,
                                        MACROBLOCK *const x, int mi_row,
                                        int mi_col, BLOCK_SIZE bsize) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  assert(bsize < BLOCK_SIZES_ALL);
  const int mi_width = mi_size_wide[bsize];
  const int mi_height = mi_size_high[bsize];

  set_mode_info_offsets(&cpi->common.mi_params, &cpi->mbmi_ext_info, x, xd,
                        mi_row, mi_col);

  set_entropy_context(xd, mi_row, mi_col, num_planes);
  xd->above_txfm_context = cm->above_contexts.txfm[tile->tile_row] + mi_col;
  xd->left_txfm_context =
      xd->left_txfm_context_buffer + (mi_row & MAX_MIB_MASK);

  // Set up destination pointers.
  av1_setup_dst_planes(xd->plane, bsize, &cm->cur_frame->buf, mi_row, mi_col, 0,
                       num_planes);

  // Set up limit values for MV components.
  // Mv beyond the range do not produce new/different prediction block.
  av1_set_mv_limits(&cm->mi_params, &x->mv_limits, mi_row, mi_col, mi_height,
                    mi_width, cpi->oxcf.border_in_pixels);

  set_plane_n4(xd, mi_width, mi_height, num_planes);

  // Set up distance of MB to edge of frame in 1/8th pel units.
  assert(!(mi_col & (mi_width - 1)) && !(mi_row & (mi_height - 1)));
  set_mi_row_col(xd, tile, mi_row, mi_height, mi_col, mi_width,
                 cm->mi_params.mi_rows, cm->mi_params.mi_cols);

  // Set up source buffers.
  av1_setup_src_planes(x, cpi->source, mi_row, mi_col, num_planes, bsize);

  // required by av1_append_sub8x8_mvs_for_idx() and av1_find_best_ref_mvs()
  xd->tile = *tile;
}